

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

void compute_sorted_huffman(Codebook *c,uint8 *lengths,uint32 *values)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  long in_RDX;
  long in_RSI;
  Codebook *in_RDI;
  int m;
  int n;
  int x;
  uint32 code;
  int huff_len;
  int k;
  int len;
  int i;
  uint8 local_3d;
  int local_3c;
  int local_34;
  int local_30;
  int local_24;
  int local_1c;
  
  if (in_RDI->sparse == '\0') {
    local_24 = 0;
    for (local_1c = 0; local_1c < in_RDI->entries; local_1c = local_1c + 1) {
      iVar1 = include_in_sort(in_RDI,*(uint8 *)(in_RSI + local_1c));
      if (iVar1 != 0) {
        uVar2 = bit_reverse(in_RDI->codewords[local_1c]);
        in_RDI->sorted_codewords[local_24] = uVar2;
        local_24 = local_24 + 1;
      }
    }
  }
  else {
    for (local_1c = 0; local_1c < in_RDI->sorted_entries; local_1c = local_1c + 1) {
      uVar2 = bit_reverse(in_RDI->codewords[local_1c]);
      in_RDI->sorted_codewords[local_1c] = uVar2;
    }
  }
  qsort(in_RDI->sorted_codewords,(long)in_RDI->sorted_entries,4,uint32_compare);
  in_RDI->sorted_codewords[in_RDI->sorted_entries] = 0xffffffff;
  if (in_RDI->sparse == '\0') {
    local_3c = in_RDI->entries;
  }
  else {
    local_3c = in_RDI->sorted_entries;
  }
  for (local_1c = 0; local_1c < local_3c; local_1c = local_1c + 1) {
    if (in_RDI->sparse == '\0') {
      local_3d = *(uint8 *)(in_RSI + local_1c);
    }
    else {
      local_3d = *(uint8 *)(in_RSI + (ulong)*(uint *)(in_RDX + (long)local_1c * 4));
    }
    iVar1 = include_in_sort(in_RDI,local_3d);
    if (iVar1 != 0) {
      uVar2 = bit_reverse(in_RDI->codewords[local_1c]);
      local_30 = 0;
      iVar1 = in_RDI->sorted_entries;
      while (local_34 = iVar1, 1 < local_34) {
        iVar3 = local_34 >> 1;
        iVar1 = iVar3;
        if (in_RDI->sorted_codewords[local_30 + iVar3] <= uVar2) {
          iVar1 = local_34 - iVar3;
          local_30 = local_30 + iVar3;
        }
      }
      if (in_RDI->sparse == '\0') {
        in_RDI->sorted_values[local_30] = local_1c;
      }
      else {
        in_RDI->sorted_values[local_30] = *(int *)(in_RDX + (long)local_1c * 4);
        in_RDI->codeword_lengths[local_30] = local_3d;
      }
    }
  }
  return;
}

Assistant:

static void compute_sorted_huffman(Codebook *c, uint8 *lengths, uint32 *values)
{
   int i, len;
   // build a list of all the entries
   // OPTIMIZATION: don't include the short ones, since they'll be caught by FAST_HUFFMAN.
   // this is kind of a frivolous optimization--I don't see any performance improvement,
   // but it's like 4 extra lines of code, so.
   if (!c->sparse) {
      int k = 0;
      for (i=0; i < c->entries; ++i)
         if (include_in_sort(c, lengths[i]))
            c->sorted_codewords[k++] = bit_reverse(c->codewords[i]);
      assert(k == c->sorted_entries);
   } else {
      for (i=0; i < c->sorted_entries; ++i)
         c->sorted_codewords[i] = bit_reverse(c->codewords[i]);
   }

   qsort(c->sorted_codewords, c->sorted_entries, sizeof(c->sorted_codewords[0]), uint32_compare);
   c->sorted_codewords[c->sorted_entries] = 0xffffffff;

   len = c->sparse ? c->sorted_entries : c->entries;
   // now we need to indicate how they correspond; we could either
   //   #1: sort a different data structure that says who they correspond to
   //   #2: for each sorted entry, search the original list to find who corresponds
   //   #3: for each original entry, find the sorted entry
   // #1 requires extra storage, #2 is slow, #3 can use binary search!
   for (i=0; i < len; ++i) {
      int huff_len = c->sparse ? lengths[values[i]] : lengths[i];
      if (include_in_sort(c,huff_len)) {
         uint32 code = bit_reverse(c->codewords[i]);
         int x=0, n=c->sorted_entries;
         while (n > 1) {
            // invariant: sc[x] <= code < sc[x+n]
            int m = x + (n >> 1);
            if (c->sorted_codewords[m] <= code) {
               x = m;
               n -= (n>>1);
            } else {
               n >>= 1;
            }
         }
         assert(c->sorted_codewords[x] == code);
         if (c->sparse) {
            c->sorted_values[x] = values[i];
            c->codeword_lengths[x] = huff_len;
         } else {
            c->sorted_values[x] = i;
         }
      }
   }
}